

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.hpp
# Opt level: O2

void __thiscall
cs::statement_case::statement_case
          (statement_case *this,var *tag,
          deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *b,context_t *c,
          token_base *ptr)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  statement_block *this_00;
  EVP_PKEY_CTX *src;
  any local_b0;
  __shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2> local_a8;
  __shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2> local_98;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_80;
  
  std::__shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_98,&c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>);
  _Var1._M_pi = local_98._M_refcount._M_pi;
  (this->super_statement_base)._vptr_statement_base = (_func_int **)&PTR__statement_base_0023ce78;
  local_98._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_statement_base).context.
  super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_98._M_ptr;
  (this->super_statement_base).context.
  super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var1._M_pi;
  local_98._M_ptr = (element_type *)0x0;
  (this->super_statement_base).line_num = ptr->line_num;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
  (this->super_statement_base)._vptr_statement_base = (_func_int **)&PTR__statement_case_0023cf20;
  local_b0.mDat = tag->mDat;
  if (local_b0.mDat != (proxy *)0x0) {
    (local_b0.mDat)->refcount = (local_b0.mDat)->refcount + 1;
  }
  src = (EVP_PKEY_CTX *)&local_b0;
  copy((EVP_PKEY_CTX *)&this->mTag,src);
  cs_impl::any::recycle(&local_b0);
  this_00 = (statement_block *)statement_base::operator_new((statement_base *)0x70,(size_t)src);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_80,b);
  std::__shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_a8,&c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>);
  statement_block::statement_block
            (this_00,(deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_80
             ,(context_t *)&local_a8,ptr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8._M_refcount);
  std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
            (&local_80);
  this->mBlock = this_00;
  return;
}

Assistant:

statement_case(const var &tag, const std::deque<statement_base *> &b, const context_t &c, token_base *ptr)
			: statement_base(c, ptr), mTag(copy(tag)), mBlock(new statement_block(b, c, ptr)) {}